

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O1

bool FormatBoot(string *path)

{
  bool bVar1;
  int iVar2;
  uint8_t *pv;
  shared_ptr<HDD> hdd;
  undefined1 local_40 [16];
  string local_30;
  
  std::__cxx11::string::rfind((char)path,0x3a);
  std::__cxx11::string::substr((ulong)&local_30,(ulong)path);
  HDD::OpenDisk((HDD *)local_40,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((HDD *)local_40._0_8_ == (HDD *)0x0) {
LAB_0014ccbc:
    Error("open");
  }
  else {
    bVar1 = HDD::Seek((HDD *)local_40._0_8_,0);
    if (!bVar1) goto LAB_0014ccbc;
    iVar2 = (*(*(_func_int ***)local_40._0_8_)[2])();
    if ((char)iVar2 != '\0') {
      iVar2 = (*(*(_func_int ***)local_40._0_8_)[3])();
      if ((char)iVar2 != '\0') {
        pv = AllocMem(*(int *)(local_40._0_8_ + 0x18));
        iVar2 = HDD::Write((HDD *)local_40._0_8_,pv,1,false);
        bVar1 = iVar2 != 0;
        if (!bVar1) {
          Error("write");
        }
        (*(*(_func_int ***)local_40._0_8_)[4])();
        FreeMem(pv);
        goto LAB_0014ccca;
      }
    }
  }
  bVar1 = false;
LAB_0014ccca:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  return bVar1;
}

Assistant:

bool FormatBoot(const std::string& path)
{
    bool fRet = false;

    // Strip ":0" from end of string
    auto hdd = HDD::OpenDisk(path.substr(0, path.rfind(':')));

    if (!hdd.get() || !hdd->Seek(0))
        Error("open");
    else if (hdd->SafetyCheck() && hdd->Lock())
    {
        MEMORY mem(hdd->sector_size);

        if (!hdd->Write(mem, 1))
            Error("write");
        else
            fRet = true;

        hdd->Unlock();
    }

    return fRet;
}